

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMesh.cpp
# Opt level: O1

int __thiscall
cbtTriangleMesh::findOrAddVertex
          (cbtTriangleMesh *this,cbtVector3 *vertex,bool removeDuplicateVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cbtVector3 *ptr;
  float *pfVar4;
  cbtIndexedMesh *pcVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  int in_EAX;
  ulong uVar10;
  cbtVector3 *pcVar11;
  float *pfVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  cbtScalar *pcVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (this->m_use4componentVertices == true) {
    if (removeDuplicateVertices) {
      uVar15 = (ulong)(this->m_4componentVertices).m_size;
      bVar20 = 0 < (long)uVar15;
      if (0 < (long)uVar15) {
        pcVar11 = (this->m_4componentVertices).m_data;
        fVar7 = pcVar11->m_floats[1] - vertex->m_floats[1];
        auVar21 = ZEXT416((uint)(pcVar11->m_floats[0] - vertex->m_floats[0]));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar21,auVar21);
        auVar22 = ZEXT416((uint)(pcVar11->m_floats[2] - vertex->m_floats[2]));
        auVar21 = vfmadd231ss_fma(auVar21,auVar22,auVar22);
        uVar10 = 0;
        if (this->m_weldingThreshold < auVar21._0_4_) {
          pcVar17 = pcVar11[1].m_floats + 2;
          uVar10 = 0;
          do {
            if (uVar15 - 1 == uVar10) goto LAB_008f233a;
            fVar7 = pcVar17[-1] - vertex->m_floats[1];
            auVar21 = ZEXT416((uint)(((cbtVector3 *)(pcVar17 + -2))->m_floats[0] -
                                    vertex->m_floats[0]));
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar21,auVar21);
            auVar22 = ZEXT416((uint)(*pcVar17 - vertex->m_floats[2]));
            auVar21 = vfmadd231ss_fma(auVar21,auVar22,auVar22);
            pcVar17 = pcVar17 + 4;
            uVar10 = uVar10 + 1;
          } while (this->m_weldingThreshold < auVar21._0_4_);
          bVar20 = uVar10 < uVar15;
        }
        if (bVar20) {
          return (int)uVar10;
        }
      }
    }
LAB_008f233a:
    piVar1 = &((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_numVertices;
    *piVar1 = *piVar1 + 1;
    iVar14 = (this->m_4componentVertices).m_size;
    iVar19 = (this->m_4componentVertices).m_capacity;
    if (iVar14 == iVar19) {
      iVar18 = 1;
      if (iVar14 != 0) {
        iVar18 = iVar14 * 2;
      }
      if (iVar19 < iVar18) {
        if (iVar18 == 0) {
          pcVar11 = (cbtVector3 *)0x0;
        }
        else {
          pcVar11 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar18 << 4,0x10);
        }
        lVar13 = (long)(this->m_4componentVertices).m_size;
        if (0 < lVar13) {
          lVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar16);
            uVar9 = puVar2[1];
            puVar3 = (undefined8 *)((long)pcVar11->m_floats + lVar16);
            *puVar3 = *puVar2;
            puVar3[1] = uVar9;
            lVar16 = lVar16 + 0x10;
          } while (lVar13 * 0x10 != lVar16);
        }
        ptr = (this->m_4componentVertices).m_data;
        if (ptr != (cbtVector3 *)0x0) {
          if ((this->m_4componentVertices).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr);
          }
          (this->m_4componentVertices).m_data = (cbtVector3 *)0x0;
        }
        (this->m_4componentVertices).m_ownsMemory = true;
        (this->m_4componentVertices).m_data = pcVar11;
        (this->m_4componentVertices).m_capacity = iVar18;
      }
    }
    uVar9 = *(undefined8 *)(vertex->m_floats + 2);
    pcVar11 = (this->m_4componentVertices).m_data + (this->m_4componentVertices).m_size;
    *(undefined8 *)pcVar11->m_floats = *(undefined8 *)vertex->m_floats;
    *(undefined8 *)(pcVar11->m_floats + 2) = uVar9;
    iVar14 = (this->m_4componentVertices).m_size;
    (this->m_4componentVertices).m_size = iVar14 + 1;
    ((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_vertexBase =
         (uchar *)(this->m_4componentVertices).m_data;
  }
  else {
    if (removeDuplicateVertices) {
      iVar14 = (this->m_3componentVertices).m_size;
      bVar20 = 0 < iVar14;
      if (0 < iVar14) {
        pfVar12 = (this->m_3componentVertices).m_data;
        fVar7 = this->m_weldingThreshold;
        fVar8 = pfVar12[1] - vertex->m_floats[1];
        auVar21 = ZEXT416((uint)(*pfVar12 - vertex->m_floats[0]));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar21,auVar21);
        auVar22 = ZEXT416((uint)(pfVar12[2] - vertex->m_floats[2]));
        auVar21 = vfmadd231ss_fma(auVar21,auVar22,auVar22);
        in_EAX = 0;
        if (fVar7 < auVar21._0_4_) {
          in_EAX = 0;
          lVar13 = 3;
          iVar19 = 1;
          do {
            bVar20 = (int)lVar13 < iVar14;
            if (iVar14 <= (int)lVar13) break;
            fVar8 = pfVar12[lVar13 + 1] - vertex->m_floats[1];
            auVar21 = ZEXT416((uint)(pfVar12[lVar13] - vertex->m_floats[0]));
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar21,auVar21);
            auVar22 = ZEXT416((uint)(pfVar12[lVar13 + 2] - vertex->m_floats[2]));
            auVar21 = vfmadd231ss_fma(auVar21,auVar22,auVar22);
            lVar13 = lVar13 + 3;
            bVar6 = fVar7 < auVar21._0_4_;
            if (!bVar6) {
              in_EAX = iVar19;
            }
            iVar19 = iVar19 + 1;
          } while (bVar6);
        }
      }
      if (bVar20) {
        return in_EAX;
      }
    }
    iVar14 = (this->m_3componentVertices).m_size;
    iVar19 = (this->m_3componentVertices).m_capacity;
    if (iVar14 == iVar19) {
      iVar18 = 1;
      if (iVar14 != 0) {
        iVar18 = iVar14 * 2;
      }
      if (iVar19 < iVar18) {
        if (iVar18 == 0) {
          pfVar12 = (float *)0x0;
        }
        else {
          pfVar12 = (float *)cbtAlignedAllocInternal((long)iVar18 << 2,0x10);
        }
        lVar13 = (long)(this->m_3componentVertices).m_size;
        if (0 < lVar13) {
          pfVar4 = (this->m_3componentVertices).m_data;
          lVar16 = 0;
          do {
            pfVar12[lVar16] = pfVar4[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar13 != lVar16);
        }
        pfVar4 = (this->m_3componentVertices).m_data;
        if (pfVar4 != (float *)0x0) {
          if ((this->m_3componentVertices).m_ownsMemory == true) {
            cbtAlignedFreeInternal(pfVar4);
          }
          (this->m_3componentVertices).m_data = (float *)0x0;
        }
        (this->m_3componentVertices).m_ownsMemory = true;
        (this->m_3componentVertices).m_data = pfVar12;
        (this->m_3componentVertices).m_capacity = iVar18;
      }
    }
    iVar14 = (this->m_3componentVertices).m_size;
    (this->m_3componentVertices).m_data[iVar14] = vertex->m_floats[0];
    iVar14 = iVar14 + 1;
    (this->m_3componentVertices).m_size = iVar14;
    iVar19 = (this->m_3componentVertices).m_capacity;
    if (iVar14 == iVar19) {
      iVar18 = 1;
      if (iVar14 != 0) {
        iVar18 = iVar14 * 2;
      }
      if (iVar19 < iVar18) {
        if (iVar18 == 0) {
          pfVar12 = (float *)0x0;
        }
        else {
          pfVar12 = (float *)cbtAlignedAllocInternal((long)iVar18 << 2,0x10);
        }
        lVar13 = (long)(this->m_3componentVertices).m_size;
        if (0 < lVar13) {
          pfVar4 = (this->m_3componentVertices).m_data;
          lVar16 = 0;
          do {
            pfVar12[lVar16] = pfVar4[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar13 != lVar16);
        }
        pfVar4 = (this->m_3componentVertices).m_data;
        if (pfVar4 != (float *)0x0) {
          if ((this->m_3componentVertices).m_ownsMemory == true) {
            cbtAlignedFreeInternal(pfVar4);
          }
          (this->m_3componentVertices).m_data = (float *)0x0;
        }
        (this->m_3componentVertices).m_ownsMemory = true;
        (this->m_3componentVertices).m_data = pfVar12;
        (this->m_3componentVertices).m_capacity = iVar18;
      }
    }
    iVar14 = (this->m_3componentVertices).m_size;
    (this->m_3componentVertices).m_data[iVar14] = vertex->m_floats[1];
    iVar14 = iVar14 + 1;
    (this->m_3componentVertices).m_size = iVar14;
    iVar19 = (this->m_3componentVertices).m_capacity;
    if (iVar14 == iVar19) {
      iVar18 = 1;
      if (iVar14 != 0) {
        iVar18 = iVar14 * 2;
      }
      if (iVar19 < iVar18) {
        if (iVar18 == 0) {
          pfVar12 = (float *)0x0;
        }
        else {
          pfVar12 = (float *)cbtAlignedAllocInternal((long)iVar18 << 2,0x10);
        }
        lVar13 = (long)(this->m_3componentVertices).m_size;
        if (0 < lVar13) {
          pfVar4 = (this->m_3componentVertices).m_data;
          lVar16 = 0;
          do {
            pfVar12[lVar16] = pfVar4[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar13 != lVar16);
        }
        pfVar4 = (this->m_3componentVertices).m_data;
        if (pfVar4 != (float *)0x0) {
          if ((this->m_3componentVertices).m_ownsMemory == true) {
            cbtAlignedFreeInternal(pfVar4);
          }
          (this->m_3componentVertices).m_data = (float *)0x0;
        }
        (this->m_3componentVertices).m_ownsMemory = true;
        (this->m_3componentVertices).m_data = pfVar12;
        (this->m_3componentVertices).m_capacity = iVar18;
      }
    }
    pfVar12 = (this->m_3componentVertices).m_data;
    iVar14 = (this->m_3componentVertices).m_size;
    pfVar12[iVar14] = vertex->m_floats[2];
    iVar14 = iVar14 + 1;
    (this->m_3componentVertices).m_size = iVar14;
    pcVar5 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
    piVar1 = &pcVar5->m_numVertices;
    *piVar1 = *piVar1 + 1;
    pcVar5->m_vertexBase = (uchar *)pfVar12;
    iVar14 = iVar14 / 3 + -1;
  }
  return iVar14;
}

Assistant:

int cbtTriangleMesh::findOrAddVertex(const cbtVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
		{
			for (int i = 0; i < m_4componentVertices.size(); i++)
			{
				if ((m_4componentVertices[i] - vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size() - 1;
	}
	else
	{
		if (removeDuplicateVertices)
		{
			for (int i = 0; i < m_3componentVertices.size(); i += 3)
			{
				cbtVector3 vtx(m_3componentVertices[i], m_3componentVertices[i + 1], m_3componentVertices[i + 2]);
				if ((vtx - vertex).length2() <= m_weldingThreshold)
				{
					return i / 3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size() / 3) - 1;
	}
}